

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O2

int main(void)

{
  double dVar1;
  int iVar2;
  GLFWwindow *handle;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  GLFWwindow **ppGVar4;
  long lVar5;
  undefined8 in_R8;
  bool bVar6;
  double dVar7;
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    ppGVar4 = windows;
    lVar5 = 0;
    uVar3 = extraout_RDX;
    while( true ) {
      if (lVar5 == 2) {
        activeWindow = windows[0];
        key_callback((GLFWwindow *)0x0,0x48,(int)uVar3,1,(int)in_R8);
        bVar6 = true;
        while (bVar6) {
          if (delay != 0) {
            dVar7 = glfwGetTime();
            for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x10) {
              dVar1 = *(double *)((long)&commands[0].time + lVar5);
              if (((dVar1 != 0.0) || (NAN(dVar1))) && (3.0 <= dVar7 - dVar1)) {
                command_callback(*(int *)((long)&commands[0].key + lVar5));
                *(undefined8 *)((long)&commands[0].time + lVar5) = 0;
              }
            }
          }
          iVar2 = glfwWindowShouldClose(windows[0]);
          if (iVar2 == 0) {
            iVar2 = glfwWindowShouldClose(windows[1]);
            bVar6 = iVar2 == 0;
          }
          else {
            bVar6 = false;
          }
          glfwPollEvents();
        }
        glfwTerminate();
        exit(0);
      }
      in_R8 = 0;
      handle = glfwCreateWindow(W,H,"Cursor testing",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      *ppGVar4 = handle;
      if (handle == (GLFWwindow *)0x0) break;
      glfwSetWindowPos(handle,(int)lVar5 * (W + 0x32) + 100,100);
      glfwSetWindowRefreshCallback(*ppGVar4,refresh_callback);
      glfwSetFramebufferSizeCallback(*ppGVar4,framebuffer_size_callback);
      glfwSetKeyCallback(*ppGVar4,key_callback);
      glfwSetWindowFocusCallback(*ppGVar4,focus_callback);
      glfwMakeContextCurrent(*ppGVar4);
      glClear(0x4000);
      glfwSwapBuffers(*ppGVar4);
      lVar5 = lVar5 + 1;
      ppGVar4 = ppGVar4 + 1;
      uVar3 = extraout_RDX_00;
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLboolean running = GL_TRUE;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (i = 0; i < 2; i++)
    {
        windows[i] = glfwCreateWindow(W, H, "Cursor testing", NULL, NULL);

        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetWindowPos(windows[i], 100 + (i & 1) * (W + 50), 100);

        glfwSetWindowRefreshCallback(windows[i], refresh_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetWindowFocusCallback(windows[i], focus_callback);

        glfwMakeContextCurrent(windows[i]);
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(windows[i]);
    }

    activeWindow = windows[0];

    key_callback(NULL, GLFW_KEY_H, 0, GLFW_PRESS, 0);

    while (running)
    {
        if (delay)
        {
            int i;
            double t = glfwGetTime();

            for (i = 0; i < CommandCount; i++)
            {
                if (commands[i].time != 0 && t - commands[i].time >= 3.0)
                {
                    command_callback(commands[i].key);
                    commands[i].time = 0;
                }
            }
        }

        running = !(glfwWindowShouldClose(windows[0]) || glfwWindowShouldClose(windows[1]));

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}